

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

value_type *
phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>::
new_element<phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>,std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::Enum_const&>,std::tuple<>>
          (Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *alloc,piecewise_construct_t *args,
          tuple<const_phmap::priv::hash_internal::Enum_&> *args_1,tuple<> *args_2)

{
  pointer ppVar1;
  PairAlloc pair_alloc;
  
  pair_alloc.id_ = alloc->id_;
  ppVar1 = allocator_traits<phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::allocate(&pair_alloc,1);
  ppVar1->first =
       *(args_1->super__Tuple_impl<0UL,_const_phmap::priv::hash_internal::Enum_&>).
        super__Head_base<0UL,_const_phmap::priv::hash_internal::Enum_&,_false>._M_head_impl;
  (ppVar1->second)._M_dataplus._M_p = (pointer)&(ppVar1->second).field_2;
  (ppVar1->second)._M_string_length = 0;
  (ppVar1->second).field_2._M_local_buf[0] = '\0';
  return ppVar1;
}

Assistant:

static value_type* new_element(Allocator* alloc, Args&&... args) {
        using PairAlloc = typename phmap::allocator_traits<
            Allocator>::template rebind_alloc<value_type>;
        PairAlloc pair_alloc(*alloc);
        value_type* res =
            phmap::allocator_traits<PairAlloc>::allocate(pair_alloc, 1);
        phmap::allocator_traits<PairAlloc>::construct(pair_alloc, res,
                                                      std::forward<Args>(args)...);
        return res;
    }